

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O3

uint32_t hash_bitmap(ALLEGRO_BITMAP *bmp)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t uVar7;
  
  uVar1 = al_get_bitmap_width();
  uVar2 = al_get_bitmap_height(bmp);
  plVar3 = (long *)al_lock_bitmap(bmp,0x19,1);
  if ((int)uVar2 < 1) {
    uVar7 = 0x811c9dc5;
  }
  else {
    lVar4 = *plVar3 + 3;
    uVar7 = 0x811c9dc5;
    uVar5 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          uVar7 = ((int)*(char *)(lVar4 + -3 + uVar6 * 4) ^
                  ((int)*(char *)(lVar4 + -2 + uVar6 * 4) ^
                  ((int)*(char *)(lVar4 + -1 + uVar6 * 4) ^
                  ((int)*(char *)(lVar4 + uVar6 * 4) ^ uVar7) * 0x1000193) * 0x1000193) * 0x1000193)
                  * 0x1000193;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + *(int *)((long)plVar3 + 0xc);
    } while (uVar5 != uVar2);
  }
  al_unlock_bitmap(bmp);
  return uVar7;
}

Assistant:

static uint32_t hash_bitmap(ALLEGRO_BITMAP *bmp)
{
   ALLEGRO_LOCKED_REGION *lr;
   int x, y, w, h;
   uint32_t hash;

   w = al_get_bitmap_width(bmp);
   h = al_get_bitmap_height(bmp);
   hash = FNV_OFFSET_BASIS;

   lr = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_ABGR_8888_LE,
      ALLEGRO_LOCK_READONLY);

   for (y = 0; y < h; y++) {
      /* Oops, I unintentially committed the first version of this with signed
       * chars and computing in BGRA order, so leave it like that so we don't
       * have to update a bunch of old hashes.
       */
      signed char const *data = ((signed char const *)lr->data) + y*lr->pitch;
      for (x = 0; x < w; x++) {
         hash ^= data[x*4 + 3]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 2]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 1]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 0]; hash *= FNV_PRIME;
      }
   }

   al_unlock_bitmap(bmp);

   return hash;
}